

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

int glfwExtensionSupported(char *extension)

{
  int iVar1;
  GLFWbool GVar2;
  undefined8 in_RAX;
  _GLFWwindow *p_Var3;
  GLubyte *pGVar4;
  GLuint GVar5;
  char *format;
  GLint count;
  undefined8 uStack_28;
  
  if (extension == (char *)0x0) {
    __assert_fail("extension != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/glfw/src/context.c"
                  ,0x282,"int glfwExtensionSupported(const char *)");
  }
  if (_glfwInitialized == 0) {
    iVar1 = 0x10001;
  }
  else {
    uStack_28 = in_RAX;
    p_Var3 = _glfwPlatformGetCurrentContext();
    if (p_Var3 != (_GLFWwindow *)0x0) {
      if (*extension != '\0') {
        if ((p_Var3->context).major < 3) {
          pGVar4 = (*(p_Var3->context).GetString)(0x1f03);
          if (pGVar4 == (GLubyte *)0x0) {
LAB_00181d5b:
            format = "Extension string retrieval is broken";
            iVar1 = 0x10008;
            goto LAB_00181d00;
          }
          GVar2 = _glfwStringInExtensionString(extension,(char *)pGVar4);
          if (GVar2 != 0) {
            return 1;
          }
        }
        else {
          (*(p_Var3->context).GetIntegerv)(0x821d,(GLint *)((long)&uStack_28 + 4));
          if (0 < uStack_28._4_4_) {
            GVar5 = 0;
            do {
              pGVar4 = (*(p_Var3->context).GetStringi)(0x1f03,GVar5);
              if (pGVar4 == (GLubyte *)0x0) goto LAB_00181d5b;
              iVar1 = strcmp((char *)pGVar4,extension);
              if (iVar1 == 0) {
                return 1;
              }
              GVar5 = GVar5 + 1;
            } while ((int)GVar5 < uStack_28._4_4_);
          }
        }
        iVar1 = (*(p_Var3->context).extensionSupported)(extension);
        return iVar1;
      }
      format = "Extension name is empty string";
      iVar1 = 0x10004;
      goto LAB_00181d00;
    }
    iVar1 = 0x10002;
  }
  format = (char *)0x0;
LAB_00181d00:
  _glfwInputError(iVar1,format);
  return 0;
}

Assistant:

GLFWAPI int glfwExtensionSupported(const char* extension)
{
    _GLFWwindow* window;

    assert(extension != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    window = _glfwPlatformGetCurrentContext();
    if (!window)
    {
        _glfwInputError(GLFW_NO_CURRENT_CONTEXT, NULL);
        return GLFW_FALSE;
    }

    if (*extension == '\0')
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Extension name is empty string");
        return GLFW_FALSE;
    }

    if (window->context.major >= 3)
    {
        int i;
        GLint count;

        // Check if extension is in the modern OpenGL extensions string list

        window->context.GetIntegerv(GL_NUM_EXTENSIONS, &count);

        for (i = 0;  i < count;  i++)
        {
            const char* en = (const char*)
                window->context.GetStringi(GL_EXTENSIONS, i);
            if (!en)
            {
                _glfwInputError(GLFW_PLATFORM_ERROR,
                                "Extension string retrieval is broken");
                return GLFW_FALSE;
            }

            if (strcmp(en, extension) == 0)
                return GLFW_TRUE;
        }
    }
    else
    {
        // Check if extension is in the old style OpenGL extensions string

        const char* extensions = (const char*)
            window->context.GetString(GL_EXTENSIONS);
        if (!extensions)
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "Extension string retrieval is broken");
            return GLFW_FALSE;
        }

        if (_glfwStringInExtensionString(extension, extensions))
            return GLFW_TRUE;
    }

    // Check if extension is in the platform-specific string
    return window->context.extensionSupported(extension);
}